

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

size_t __thiscall
Diligent::Serializer<(Diligent::SerializerMode)1>::GetSize
          (Serializer<(Diligent::SerializerMode)1> *this)

{
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  Serializer<(Diligent::SerializerMode)1> *this_local;
  
  if (this->m_Ptr < this->m_Start) {
    msg.field_2._8_8_ = this;
    FormatString<char[26],char[17]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Ptr >= m_Start",(char (*) [17])this);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetSize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x10b);
    std::__cxx11::string::~string((string *)local_30);
  }
  return (long)this->m_Ptr - (long)this->m_Start;
}

Assistant:

size_t GetSize() const
    {
        VERIFY_EXPR(m_Ptr >= m_Start);
        return m_Ptr - m_Start;
    }